

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

OptBuilder __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::operator[]
          (CommandLine<Catch::ConfigData> *this,string *optName)

{
  reference pvVar1;
  string *in_RDX;
  Arg local_c8;
  string *local_20;
  string *optName_local;
  CommandLine<Catch::ConfigData> *this_local;
  OptBuilder *builder;
  
  local_20 = in_RDX;
  optName_local = optName;
  this_local = this;
  Arg::Arg(&local_c8);
  std::
  vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::push_back((vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
               *)&optName->_M_string_length,&local_c8);
  Arg::~Arg(&local_c8);
  pvVar1 = std::
           vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ::back((vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                   *)&optName->_M_string_length);
  addOptName(pvVar1,local_20);
  pvVar1 = std::
           vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ::back((vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                   *)&optName->_M_string_length);
  OptBuilder::OptBuilder((OptBuilder *)this,pvVar1);
  return (OptBuilder)(ArgBuilder)this;
}

Assistant:

OptBuilder operator[]( std::string const& optName ) {
            m_options.push_back( Arg() );
            addOptName( m_options.back(), optName );
            OptBuilder builder( &m_options.back() );
            return builder;
        }